

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

Descriptor *
google::protobuf::anon_unknown_19::DefaultFinderFindAnyType
          (Message *message,string *prefix,string *name)

{
  bool bVar1;
  Descriptor *pDVar2;
  FileDescriptor *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  DescriptorPool *unaff_retaddr;
  char *in_stack_ffffffffffffffd8;
  string *in_stack_fffffffffffffff8;
  
  bVar1 = std::operator!=(in_RDX,in_stack_ffffffffffffffd8);
  if ((bVar1) && (bVar1 = std::operator!=(in_RDX,in_stack_ffffffffffffffd8), bVar1)) {
    pDVar2 = (Descriptor *)0x0;
  }
  else {
    pDVar2 = Message::GetDescriptor((Message *)in_RDX);
    this = Descriptor::file(pDVar2);
    FileDescriptor::pool(this);
    pDVar2 = DescriptorPool::FindMessageTypeByName(unaff_retaddr,in_stack_fffffffffffffff8);
  }
  return pDVar2;
}

Assistant:

const Descriptor* DefaultFinderFindAnyType(const Message& message,
                                           const std::string& prefix,
                                           const std::string& name) {
  if (prefix != internal::kTypeGoogleApisComPrefix &&
      prefix != internal::kTypeGoogleProdComPrefix) {
    return nullptr;
  }
  return message.GetDescriptor()->file()->pool()->FindMessageTypeByName(name);
}